

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter_state.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true> __thiscall
duckdb::TableFilterState::Initialize
          (TableFilterState *this,ClientContext *context,TableFilter *filter)

{
  pointer puVar1;
  __uniq_ptr_impl<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_> _Var2;
  StructFilter *pSVar3;
  ExpressionFilter *pEVar4;
  type args_1;
  ConjunctionOrFilter *pCVar5;
  pointer pCVar6;
  ConjunctionAndFilter *pCVar7;
  pointer pCVar8;
  type pTVar9;
  InternalException *this_00;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  pointer puVar10;
  TableFilterState local_60;
  __uniq_ptr_impl<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_> local_58
  ;
  string local_50;
  
  local_58._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
  .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl =
       (tuple<duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>)
       (tuple<duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>)this;
LAB_0062ee68:
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
  .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl =
       (tuple<duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>)
       (tuple<duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>)local_58;
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
  case IS_NULL:
  case IS_NOT_NULL:
  case OPTIONAL_FILTER:
    make_uniq<duckdb::TableFilterState>();
    return (unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
            )(TableFilterState *)
             _Var2._M_t.
             super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
             .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl;
  case CONJUNCTION_OR:
    pCVar5 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    make_uniq<duckdb::ConjunctionOrFilterState>();
    puVar1 = (pCVar5->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (pCVar5->super_ConjunctionFilter).child_filters.
                   super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1;
        puVar10 = puVar10 + 1) {
      pCVar6 = unique_ptr<duckdb::ConjunctionOrFilterState,_std::default_delete<duckdb::ConjunctionOrFilterState>,_true>
               ::operator->((unique_ptr<duckdb::ConjunctionOrFilterState,_std::default_delete<duckdb::ConjunctionOrFilterState>,_true>
                             *)&local_50);
      pTVar9 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(puVar10);
      Initialize(&local_60,context,pTVar9);
      ::std::
      vector<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>>
                  *)&pCVar6->child_states,
                 (unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                  *)&local_60);
      if (local_60._vptr_TableFilterState != (_func_int **)0x0) {
        (**(code **)(*local_60._vptr_TableFilterState + 8))();
      }
    }
    break;
  case CONJUNCTION_AND:
    pCVar7 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    make_uniq<duckdb::ConjunctionAndFilterState>();
    puVar1 = (pCVar7->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (pCVar7->super_ConjunctionFilter).child_filters.
                   super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1;
        puVar10 = puVar10 + 1) {
      pCVar8 = unique_ptr<duckdb::ConjunctionAndFilterState,_std::default_delete<duckdb::ConjunctionAndFilterState>,_true>
               ::operator->((unique_ptr<duckdb::ConjunctionAndFilterState,_std::default_delete<duckdb::ConjunctionAndFilterState>,_true>
                             *)&local_50);
      pTVar9 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(puVar10);
      Initialize(&local_60,context,pTVar9);
      ::std::
      vector<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>>
                  *)&pCVar8->child_states,
                 (unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                  *)&local_60);
      if (local_60._vptr_TableFilterState != (_func_int **)0x0) {
        (**(code **)(*local_60._vptr_TableFilterState + 8))();
      }
    }
    break;
  case STRUCT_EXTRACT:
    goto switchD_0062ee7d_caseD_5;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"Unsupported filter type for TableFilterState::Initialize",
               (allocator *)&local_60);
    InternalException::InternalException(this_00,&local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case EXPRESSION_FILTER:
    pEVar4 = TableFilter::Cast<duckdb::ExpressionFilter>(filter);
    args_1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pEVar4->expr);
    make_uniq<duckdb::ExpressionFilterState,duckdb::ClientContext&,duckdb::Expression&>
              ((duckdb *)&local_50,context,args_1);
  }
  *(pointer *)
   local_58._M_t.
   super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
   .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl =
       local_50._M_dataplus._M_p;
  return (unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>)
         local_58._M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
         .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl;
switchD_0062ee7d_caseD_5:
  pSVar3 = TableFilter::Cast<duckdb::StructFilter>(filter);
  filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
           operator*(&pSVar3->child_filter);
  goto LAB_0062ee68;
}

Assistant:

unique_ptr<TableFilterState> TableFilterState::Initialize(ClientContext &context, const TableFilter &filter) {
	switch (filter.filter_type) {
	case TableFilterType::OPTIONAL_FILTER:
		// optional filter is not executed - create an empty filter state
		return make_uniq<TableFilterState>();
	case TableFilterType::STRUCT_EXTRACT: {
		auto &struct_filter = filter.Cast<StructFilter>();
		return Initialize(context, *struct_filter.child_filter);
	}
	case TableFilterType::CONJUNCTION_OR: {
		auto &conj_filter = filter.Cast<ConjunctionOrFilter>();
		auto result = make_uniq<ConjunctionOrFilterState>();
		for (auto &child_filter : conj_filter.child_filters) {
			result->child_states.push_back(Initialize(context, *child_filter));
		}
		return std::move(result);
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conj_filter = filter.Cast<ConjunctionAndFilter>();
		auto result = make_uniq<ConjunctionAndFilterState>();
		for (auto &child_filter : conj_filter.child_filters) {
			result->child_states.push_back(Initialize(context, *child_filter));
		}
		return std::move(result);
	}
	case TableFilterType::EXPRESSION_FILTER: {
		auto &expr_filter = filter.Cast<ExpressionFilter>();
		return make_uniq<ExpressionFilterState>(context, *expr_filter.expr);
	}
	case TableFilterType::CONSTANT_COMPARISON:
	case TableFilterType::IS_NULL:
	case TableFilterType::IS_NOT_NULL:
		// root nodes - create an empty filter state
		return make_uniq<TableFilterState>();
	default:
		throw InternalException("Unsupported filter type for TableFilterState::Initialize");
	}
}